

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

xmlChar * xmlParseEntityValue(xmlParserCtxtPtr ctxt,xmlChar **orig)

{
  xmlChar xVar1;
  xmlChar xVar2;
  xmlParserInputPtr pxVar3;
  xmlChar *pxVar4;
  xmlChar *pxVar5;
  char *msg;
  xmlParserErrors error;
  long lVar6;
  xmlSBuf buf;
  
  buf.max = 1000000000;
  if (((uint)ctxt->options >> 0x13 & 1) == 0) {
    buf.max = 10000000;
  }
  buf.mem = (xmlChar *)0x0;
  buf.size = 0;
  buf.cap = 0;
  buf.code = XML_ERR_OK;
  pxVar3 = ctxt->input;
  if (((pxVar3->flags & 0x40) == 0) && ((long)pxVar3->end - (long)pxVar3->cur < 0xfa)) {
    xmlParserGrow(ctxt);
    pxVar3 = ctxt->input;
  }
  xVar1 = *pxVar3->cur;
  if ((xVar1 == '\"') || (xVar1 == '\'')) {
    pxVar3->cur = pxVar3->cur + 1;
    lVar6 = 0;
    while (ctxt->disableSAX < 2) {
      pxVar3 = ctxt->input;
      pxVar5 = pxVar3->cur;
      if (pxVar3->end <= pxVar5) {
        error = XML_ERR_ENTITY_NOT_FINISHED;
        msg = (char *)0x0;
LAB_001342e5:
        xmlFatalErrMsg(ctxt,error,msg);
        break;
      }
      xVar2 = *pxVar5;
      if (xVar2 == '\0') {
        msg = "invalid character in entity value\n";
        error = XML_ERR_INVALID_CHAR;
        goto LAB_001342e5;
      }
      if (xVar2 == xVar1) {
        if (orig != (xmlChar **)0x0) {
          pxVar4 = xmlStrndup(pxVar5 + -lVar6,(int)lVar6);
          *orig = pxVar4;
          if (pxVar4 == (xmlChar *)0x0) {
            xmlCtxtErrMemory(ctxt);
          }
        }
        xmlExpandPEsInEntityValue(ctxt,&buf,pxVar5 + -lVar6,(int)lVar6,ctxt->inputNr);
        pxVar3 = ctxt->input;
        if (*pxVar3->cur == '\n') {
          pxVar3->line = pxVar3->line + 1;
          pxVar3->col = 1;
        }
        else {
          pxVar3->col = pxVar3->col + 1;
        }
        pxVar3->cur = pxVar3->cur + 1;
        pxVar5 = xmlSBufFinish(&buf,(int *)0x0,ctxt,"entity length too long");
        return pxVar5;
      }
      if (xVar2 == '\n') {
        pxVar3->line = pxVar3->line + 1;
        pxVar3->col = 1;
      }
      else {
        pxVar3->col = pxVar3->col + 1;
      }
      pxVar3->cur = pxVar5 + 1;
      if (((long)pxVar3->end - (long)(pxVar5 + 1) < 10) && ((pxVar3->flags & 0x40) == 0)) {
        xmlParserGrow(ctxt);
      }
      lVar6 = lVar6 + 1;
    }
    xmlSBufCleanup(&buf,ctxt,"entity length too long");
  }
  else {
    xmlFatalErr(ctxt,XML_ERR_ATTRIBUTE_NOT_STARTED,(char *)0x0);
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlParseEntityValue(xmlParserCtxtPtr ctxt, xmlChar **orig) {
    unsigned maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                         XML_MAX_HUGE_LENGTH :
                         XML_MAX_TEXT_LENGTH;
    xmlSBuf buf;
    const xmlChar *start;
    int quote, length;

    xmlSBufInit(&buf, maxLength);

    GROW;

    quote = CUR;
    if ((quote != '"') && (quote != '\'')) {
	xmlFatalErr(ctxt, XML_ERR_ATTRIBUTE_NOT_STARTED, NULL);
	return(NULL);
    }
    CUR_PTR++;

    length = 0;

    /*
     * Copy raw content of the entity into a buffer
     */
    while (1) {
        int c;

        if (PARSER_STOPPED(ctxt))
            goto error;

        if (CUR_PTR >= ctxt->input->end) {
            xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_NOT_FINISHED, NULL);
            goto error;
        }

        c = CUR;

        if (c == 0) {
            xmlFatalErrMsg(ctxt, XML_ERR_INVALID_CHAR,
                    "invalid character in entity value\n");
            goto error;
        }
        if (c == quote)
            break;
        NEXTL(1);
        length += 1;

        /*
         * TODO: Check growth threshold
         */
        if (ctxt->input->end - CUR_PTR < 10)
            GROW;
    }

    start = CUR_PTR - length;

    if (orig != NULL) {
        *orig = xmlStrndup(start, length);
        if (*orig == NULL)
            xmlErrMemory(ctxt);
    }

    xmlExpandPEsInEntityValue(ctxt, &buf, start, length, ctxt->inputNr);

    NEXTL(1);

    return(xmlSBufFinish(&buf, NULL, ctxt, "entity length too long"));

error:
    xmlSBufCleanup(&buf, ctxt, "entity length too long");
    return(NULL);
}